

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_msmblur.h
# Opt level: O2

void __thiscall
embree::sse2::BVHBuilderMSMBlur::
BuilderT<embree::NodeRefPtr<4>,_embree::sse2::RecalculatePrimRef<embree::TriangleMesh>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeaf<4,_embree::TriangleMesh,_embree::TriangleMvMB<4>_>,_embree::Scene::BuildProgressMonitorInterface>
::splitByGeometry(BuilderT<embree::NodeRefPtr<4>,_embree::sse2::RecalculatePrimRef<embree::TriangleMesh>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeaf<4,_embree::TriangleMesh,_embree::TriangleMvMB<4>_>,_embree::Scene::BuildProgressMonitorInterface>
                  *this,SetMB *set,SetMB *lset,SetMB *rset)

{
  BBox1f BVar1;
  BBox1f BVar2;
  PrimRefMB *pPVar3;
  PrimRefVector pmVar4;
  SetMB *pSVar5;
  SetMB *pSVar6;
  PrimRefMB *prim;
  PrimRefMB *l;
  PrimRefMB *prim_00;
  long lVar7;
  uint uVar8;
  uint uVar9;
  float fVar10;
  float fVar11;
  anon_class_1_0_00000001 local_1e9;
  BBox1f local_1e8;
  undefined8 uStack_1e0;
  BBox1f local_1d8;
  undefined8 uStack_1d0;
  BBox1f local_1c0;
  unsigned_long local_1b8;
  SetMB *local_1b0;
  unsigned_long local_1a8;
  SetMB *local_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_158;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined4 local_d8;
  undefined8 local_d4;
  undefined4 local_cc;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_c8;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  undefined8 local_44;
  undefined4 local_3c;
  
  local_1b8 = (set->super_PrimInfoMB).object_range._begin;
  local_1a8 = (set->super_PrimInfoMB).object_range._end;
  local_158._0_8_ = 0x7f8000007f800000;
  local_158._8_8_ = 0x7f8000007f800000;
  local_148 = 0xff800000ff800000;
  uStack_140 = 0xff800000ff800000;
  local_138 = 0x7f8000007f800000;
  uStack_130 = 0x7f8000007f800000;
  local_128 = 0xff800000ff800000;
  uStack_120 = 0xff800000ff800000;
  local_118 = 0x7f8000007f800000;
  uStack_110 = 0x7f8000007f800000;
  local_108 = 0xff800000ff800000;
  uStack_100 = 0xff800000ff800000;
  local_f8 = 0;
  uStack_f0 = 0;
  local_e8 = 0;
  uStack_e0 = 0;
  local_d8 = 0;
  local_d4 = 0x3f8000003f800000;
  local_cc = 0;
  local_c8._0_8_ = 0x7f8000007f800000;
  local_c8._8_8_ = 0x7f8000007f800000;
  local_b8 = 0xff800000ff800000;
  uStack_b0 = 0xff800000ff800000;
  local_a8 = 0x7f8000007f800000;
  uStack_a0 = 0x7f8000007f800000;
  local_98 = 0xff800000ff800000;
  uStack_90 = 0xff800000ff800000;
  local_88 = 0x7f8000007f800000;
  uStack_80 = 0x7f8000007f800000;
  local_78 = 0xff800000ff800000;
  uStack_70 = 0xff800000ff800000;
  local_68 = 0;
  uStack_60 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_48 = 0;
  local_44 = 0x3f8000003f800000;
  local_3c = 0;
  pPVar3 = set->prims->items;
  prim_00 = pPVar3 + local_1b8;
  fVar10 = pPVar3[local_1b8].lbounds.bounds0.lower.field_0.m128[3];
  prim = pPVar3 + local_1a8;
  local_1e8 = (BBox1f)-(long)pPVar3;
  local_1d8 = (BBox1f)set;
  local_1b0 = lset;
  local_1a0 = rset;
  do {
    prim = prim + -1;
    lVar7 = (long)&(prim_00->lbounds).bounds0.lower.field_0 + (long)local_1e8;
    while ((prim_00 <= prim && ((prim_00->lbounds).bounds0.lower.field_0.m128[3] == fVar10))) {
      splitByGeometry::anon_class_1_0_00000001::operator()
                (&local_1e9,(PrimInfoMB *)&local_158.field_1,prim_00);
      prim_00 = prim_00 + 1;
      lVar7 = lVar7 + 0x50;
    }
    while( true ) {
      pSVar5 = local_1b0;
      BVar2 = local_1d8;
      if (prim < prim_00) {
        pmVar4 = *(PrimRefVector *)((long)local_1d8 + 0x90);
        local_1e8 = ((PrimInfoMB *)local_1d8)->time_range;
        uStack_1e0 = 0;
        PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
                  (&local_1b0->super_PrimInfoMB,
                   (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_158.field_1);
        pSVar6 = local_1a0;
        pSVar5->prims = pmVar4;
        (pSVar5->super_PrimInfoMB).object_range._begin = local_1b8;
        (pSVar5->super_PrimInfoMB).object_range._end = lVar7 / 0x50;
        BVar1 = (pSVar5->super_PrimInfoMB).time_range;
        fVar10 = BVar1.lower;
        fVar11 = BVar1.upper;
        uVar8 = -(uint)(fVar10 < local_1e8.lower);
        uVar9 = -(uint)(fVar11 < local_1e8.upper);
        (pSVar5->super_PrimInfoMB).time_range =
             (BBox1f)(CONCAT44(~uVar9 & (uint)local_1e8.upper,~uVar8 & (uint)fVar10) |
                     CONCAT44((uint)fVar11 & uVar9,(uint)local_1e8.lower & uVar8));
        pmVar4 = *(PrimRefVector *)((long)BVar2 + 0x90);
        local_1d8 = ((PrimInfoMB *)BVar2)->time_range;
        uStack_1d0 = 0;
        PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
                  (&local_1a0->super_PrimInfoMB,
                   (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_c8.field_1);
        pSVar6->prims = pmVar4;
        (pSVar6->super_PrimInfoMB).object_range._begin = lVar7 / 0x50;
        (pSVar6->super_PrimInfoMB).object_range._end = local_1a8;
        BVar2 = (pSVar6->super_PrimInfoMB).time_range;
        fVar10 = BVar2.lower;
        fVar11 = BVar2.upper;
        uVar8 = -(uint)(fVar10 < local_1d8.lower);
        uVar9 = -(uint)(fVar11 < local_1d8.upper);
        (pSVar6->super_PrimInfoMB).time_range =
             (BBox1f)(CONCAT44(~uVar9 & (uint)local_1d8.upper,~uVar8 & (uint)fVar10) |
                     CONCAT44((uint)fVar11 & uVar9,(uint)local_1d8.lower & uVar8));
        return;
      }
      if ((prim->lbounds).bounds0.lower.field_0.m128[3] == fVar10) break;
      splitByGeometry::anon_class_1_0_00000001::operator()
                (&local_1e9,(PrimInfoMB *)&local_c8.field_1,prim);
      prim = prim + -1;
    }
    splitByGeometry::anon_class_1_0_00000001::operator()
              (&local_1e9,(PrimInfoMB *)&local_158.field_1,prim);
    splitByGeometry::anon_class_1_0_00000001::operator()
              (&local_1e9,(PrimInfoMB *)&local_c8.field_1,prim_00);
    local_168 = *(undefined8 *)&(prim_00->lbounds).bounds0.lower.field_0;
    uStack_160 = *(undefined8 *)((long)&(prim_00->lbounds).bounds0.lower.field_0 + 8);
    local_178 = *(undefined8 *)&(prim_00->lbounds).bounds0.upper.field_0;
    uStack_170 = *(undefined8 *)((long)&(prim_00->lbounds).bounds0.upper.field_0 + 8);
    local_188 = *(undefined8 *)&(prim_00->lbounds).bounds1.lower.field_0;
    uStack_180 = *(undefined8 *)((long)&(prim_00->lbounds).bounds1.lower.field_0 + 8);
    local_198 = *(undefined8 *)&(prim_00->lbounds).bounds1.upper.field_0;
    uStack_190 = *(undefined8 *)((long)&(prim_00->lbounds).bounds1.upper.field_0 + 8);
    local_1c0 = prim_00->time_range;
    PrimRefMB::operator=(prim_00,prim);
    *(undefined8 *)&(prim->lbounds).bounds0.lower.field_0 = local_168;
    *(undefined8 *)((long)&(prim->lbounds).bounds0.lower.field_0 + 8) = uStack_160;
    *(undefined8 *)&(prim->lbounds).bounds0.upper.field_0 = local_178;
    *(undefined8 *)((long)&(prim->lbounds).bounds0.upper.field_0 + 8) = uStack_170;
    *(undefined8 *)&(prim->lbounds).bounds1.lower.field_0 = local_188;
    *(undefined8 *)((long)&(prim->lbounds).bounds1.lower.field_0 + 8) = uStack_180;
    *(undefined8 *)&(prim->lbounds).bounds1.upper.field_0 = local_198;
    *(undefined8 *)((long)&(prim->lbounds).bounds1.upper.field_0 + 8) = uStack_190;
    prim->time_range = local_1c0;
    prim_00 = prim_00 + 1;
  } while( true );
}

Assistant:

void splitByGeometry(const SetMB& set, SetMB& lset, SetMB& rset)
          {
            assert(set.size() > 1);

            mvector<PrimRefMB>& prims = *set.prims;
            const size_t begin = set.begin();
            const size_t end   = set.end();
            
            PrimInfoMB left(empty);
            PrimInfoMB right(empty);
            unsigned int geomID = prims[begin].geomID();
            size_t center = serial_partitioning(prims.data(),begin,end,left,right,
                                                [&] ( const PrimRefMB& prim ) { return prim.geomID() == geomID; },
                                                [ ] ( PrimInfoMB& dst, const PrimRefMB& prim ) { dst.add_primref(prim); });
            
            new (&lset) SetMB(left, set.prims,range<size_t>(begin,center),set.time_range);
            new (&rset) SetMB(right,set.prims,range<size_t>(center,end  ),set.time_range);
          }